

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  string local_30;
  
  Detail::stringify<bool>(&local_30,(bool *)&(this->super_ITransientExpression).field_0xa);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }